

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parsing.h
# Opt level: O0

int __thiscall Parsing::getSymbol(Parsing *this)

{
  bool bVar1;
  bool bVar2;
  reference pcVar3;
  long lVar4;
  ulong uVar5;
  difference_type dVar6;
  reference pvVar7;
  reference __args_4;
  ostream *poVar8;
  bool local_d6;
  bool local_d5;
  bool local_d4;
  bool local_d3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  int local_bc;
  string local_b8 [4];
  int targetPosition;
  int local_98;
  int local_94;
  int number;
  int symbol;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  char local_70;
  bool local_6f;
  bool local_6e;
  bool local_6d;
  int local_6c;
  char doubleDiv;
  bool isNum;
  bool isLet;
  bool isDiv;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  iterator nowPosition;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  string local_48 [8];
  string target;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  iterator now;
  Parsing *this_local;
  
  now._M_current = (char *)this;
  filter(this);
  local_20._M_current = (char *)std::__cxx11::string::begin();
  do {
    local_28._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) goto LAB_001068fc;
    std::__cxx11::string::string(local_48);
    while( true ) {
      local_50._M_current = (char *)std::__cxx11::string::end();
      bVar2 = __gnu_cxx::operator!=(&local_20,&local_50);
      bVar1 = false;
      if (bVar2) {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_20);
        bVar1 = true;
        if (*pcVar3 != ' ') {
          pcVar3 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_20);
          bVar1 = *pcVar3 == '\t';
        }
      }
      if (!bVar1) break;
      nowPosition._M_current =
           (char *)__gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator++(&local_20,0);
    }
    local_60._M_current = local_20._M_current;
    _doubleDiv = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator==
                      (&local_20,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&doubleDiv);
    if (bVar1) {
      local_6c = 3;
    }
    else {
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_20);
      local_d3 = true;
      if (*pcVar3 != '=') {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_20);
        local_d3 = true;
        if (*pcVar3 != '<') {
          pcVar3 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_20);
          local_d3 = true;
          if (*pcVar3 != '>') {
            pcVar3 = __gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_20);
            local_d3 = true;
            if (*pcVar3 != ';') {
              pcVar3 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_20);
              local_d3 = true;
              if (*pcVar3 != '.') {
                pcVar3 = __gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&local_20);
                local_d3 = true;
                if (*pcVar3 != '#') {
                  pcVar3 = __gnu_cxx::
                           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*(&local_20);
                  local_d3 = true;
                  if (*pcVar3 != ':') {
                    pcVar3 = __gnu_cxx::
                             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator*(&local_20);
                    local_d3 = true;
                    if (*pcVar3 != '+') {
                      pcVar3 = __gnu_cxx::
                               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ::operator*(&local_20);
                      local_d3 = true;
                      if (*pcVar3 != '-') {
                        pcVar3 = __gnu_cxx::
                                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ::operator*(&local_20);
                        local_d3 = true;
                        if (*pcVar3 != '*') {
                          pcVar3 = __gnu_cxx::
                                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ::operator*(&local_20);
                          local_d3 = true;
                          if (*pcVar3 != '/') {
                            pcVar3 = __gnu_cxx::
                                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ::operator*(&local_20);
                            local_d3 = true;
                            if (*pcVar3 != '(') {
                              pcVar3 = __gnu_cxx::
                                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ::operator*(&local_20);
                              local_d3 = true;
                              if (*pcVar3 != ')') {
                                pcVar3 = __gnu_cxx::
                                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         ::operator*(&local_20);
                                local_d3 = *pcVar3 == ',';
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      local_6d = local_d3;
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_20);
      if (*pcVar3 < '{') {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_20);
        local_d4 = true;
        if (*pcVar3 < 'a') goto LAB_00106112;
      }
      else {
LAB_00106112:
        pcVar3 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_20);
        local_d5 = false;
        if (*pcVar3 < '[') {
          pcVar3 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_20);
          local_d5 = '@' < *pcVar3;
        }
        local_d4 = local_d5;
      }
      local_6e = local_d4;
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_20);
      local_d6 = false;
      if (*pcVar3 < ':') {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_20);
        local_d6 = '/' < *pcVar3;
      }
      local_6f = local_d6;
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_20);
      local_70 = *pcVar3;
      while( true ) {
        local_78._M_current = (char *)std::__cxx11::string::end();
        bVar2 = __gnu_cxx::operator!=(&local_20,&local_78);
        bVar1 = false;
        if (bVar2) {
          pcVar3 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_20);
          bVar1 = true;
          if (*pcVar3 != ' ') {
            pcVar3 = __gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_20);
            bVar1 = *pcVar3 == '\t';
          }
          bVar1 = (bool)(bVar1 ^ 1);
        }
        if ((((!bVar1) ||
             (((local_6e & 1U) != 0 &&
              ((((pcVar3 = __gnu_cxx::
                           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*(&local_20), *pcVar3 == '=' ||
                 (pcVar3 = __gnu_cxx::
                           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*(&local_20), *pcVar3 == '<')) ||
                (pcVar3 = __gnu_cxx::
                          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*(&local_20), *pcVar3 == '>')) ||
               (((((pcVar3 = __gnu_cxx::
                             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator*(&local_20), *pcVar3 == ';' ||
                   (pcVar3 = __gnu_cxx::
                             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator*(&local_20), *pcVar3 == '.')) ||
                  ((pcVar3 = __gnu_cxx::
                             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator*(&local_20), *pcVar3 == '#' ||
                   ((pcVar3 = __gnu_cxx::
                              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator*(&local_20), *pcVar3 == ':' ||
                    (pcVar3 = __gnu_cxx::
                              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator*(&local_20), *pcVar3 == '+')))))) ||
                 (pcVar3 = __gnu_cxx::
                           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*(&local_20), *pcVar3 == '-')) ||
                ((((pcVar3 = __gnu_cxx::
                             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator*(&local_20), *pcVar3 == '*' ||
                   (pcVar3 = __gnu_cxx::
                             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator*(&local_20), *pcVar3 == '/')) ||
                  (pcVar3 = __gnu_cxx::
                            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator*(&local_20), *pcVar3 == '(')) ||
                 ((pcVar3 = __gnu_cxx::
                            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator*(&local_20), *pcVar3 == ')' ||
                  (pcVar3 = __gnu_cxx::
                            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator*(&local_20), *pcVar3 == ',')))))))))))) ||
            (((local_6d & 1U) != 0 &&
             ((((pcVar3 = __gnu_cxx::
                          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*(&local_20), *pcVar3 < '{' &&
                (pcVar3 = __gnu_cxx::
                          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*(&local_20), '`' < *pcVar3)) ||
               ((pcVar3 = __gnu_cxx::
                          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*(&local_20), *pcVar3 < '[' &&
                (pcVar3 = __gnu_cxx::
                          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*(&local_20), '@' < *pcVar3)))) ||
              ((pcVar3 = __gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&local_20), *pcVar3 < ':' &&
               (pcVar3 = __gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&local_20), '/' < *pcVar3)))))))) ||
           (((local_6f & 1U) != 0 &&
            (((((((pcVar3 = __gnu_cxx::
                            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator*(&local_20), *pcVar3 == '=' ||
                  (pcVar3 = __gnu_cxx::
                            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator*(&local_20), *pcVar3 == '<')) ||
                 (pcVar3 = __gnu_cxx::
                           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*(&local_20), *pcVar3 == '>')) ||
                ((pcVar3 = __gnu_cxx::
                           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*(&local_20), *pcVar3 == ';' ||
                 (pcVar3 = __gnu_cxx::
                           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*(&local_20), *pcVar3 == '.')))) ||
               (pcVar3 = __gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&local_20), *pcVar3 == '#')) ||
              (((pcVar3 = __gnu_cxx::
                          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*(&local_20), *pcVar3 == ':' ||
                (pcVar3 = __gnu_cxx::
                          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*(&local_20), *pcVar3 == '+')) ||
               ((pcVar3 = __gnu_cxx::
                          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*(&local_20), *pcVar3 == '-' ||
                (((pcVar3 = __gnu_cxx::
                            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator*(&local_20), *pcVar3 == '*' ||
                  (pcVar3 = __gnu_cxx::
                            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator*(&local_20), *pcVar3 == '/')) ||
                 (pcVar3 = __gnu_cxx::
                           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*(&local_20), *pcVar3 == '(')))))))) ||
             ((pcVar3 = __gnu_cxx::
                        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*(&local_20), *pcVar3 == ')' ||
              (pcVar3 = __gnu_cxx::
                        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*(&local_20), *pcVar3 == ',')))))))) break;
        pcVar3 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_20);
        if ((((*pcVar3 == '=') ||
             ((((pcVar3 = __gnu_cxx::
                          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*(&local_20), *pcVar3 == '<' ||
                (pcVar3 = __gnu_cxx::
                          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*(&local_20), *pcVar3 == '>')) ||
               ((pcVar3 = __gnu_cxx::
                          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*(&local_20), *pcVar3 == ';' ||
                (((pcVar3 = __gnu_cxx::
                            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator*(&local_20), *pcVar3 == '.' ||
                  (pcVar3 = __gnu_cxx::
                            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator*(&local_20), *pcVar3 == '#')) ||
                 (pcVar3 = __gnu_cxx::
                           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*(&local_20), *pcVar3 == ':')))))) ||
              ((pcVar3 = __gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&local_20), *pcVar3 == '+' ||
               (pcVar3 = __gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&local_20), *pcVar3 == '-')))))) ||
            (pcVar3 = __gnu_cxx::
                      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&local_20), *pcVar3 == '*')) ||
           (((pcVar3 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_20), *pcVar3 == '/' ||
             (pcVar3 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_20), *pcVar3 == '(')) ||
            ((pcVar3 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_20), *pcVar3 == ')' ||
             (pcVar3 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_20), *pcVar3 == ',')))))) {
          lVar4 = std::__cxx11::string::length();
          if (lVar4 == 1) {
            pcVar3 = __gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_20);
            if ((*pcVar3 != '=') || (((local_70 != '<' && (local_70 != '>')) && (local_70 != ':'))))
            break;
          }
          else {
            uVar5 = std::__cxx11::string::length();
            if (1 < uVar5) break;
          }
        }
        pcVar3 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_20);
        std::__cxx11::string::operator+=(local_48,*pcVar3);
        _number = __gnu_cxx::
                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator++(&local_20,0);
      }
      local_94 = getReservation(this,(string *)local_48);
      local_98 = 0;
      if (local_94 == -1) {
        bVar1 = isNumber(this,(string *)local_48);
        if (bVar1) {
          local_94 = this->constBase;
          local_98 = getNumber((string *)local_48);
        }
        std::__cxx11::string::string(local_b8,local_48);
        bVar1 = isIdentifier(this,(string *)local_b8);
        std::__cxx11::string::~string(local_b8);
        if (bVar1) {
          local_94 = this->identifierBase;
        }
      }
      local_c8._M_current = (char *)std::__cxx11::string::begin();
      dVar6 = __gnu_cxx::operator-(&local_60,&local_c8);
      local_bc = (int)dVar6;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&this->contentLine,(long)local_bc)
      ;
      __args_4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->contentRow,(long)local_bc);
      std::vector<Word,std::allocator<Word>>::
      emplace_back<std::__cxx11::string&,int&,int&,int&,int&>
                ((vector<Word,std::allocator<Word>> *)&this->words,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_94,&local_98,pvVar7,__args_4);
      if (local_94 == -1) {
        poVar8 = std::operator<<((ostream *)&std::cout,"parsing error in ");
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->contentLine,(long)local_bc);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pvVar7);
        poVar8 = std::operator<<(poVar8,":");
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->contentRow,(long)local_bc);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pvVar7);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        this_local._4_4_ = -1;
        local_6c = 1;
      }
      else {
        local_6c = 0;
      }
    }
    std::__cxx11::string::~string(local_48);
  } while (local_6c == 0);
  if (local_6c != 1) {
LAB_001068fc:
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int getSymbol() {
		filter();
		auto now = content.begin();
		while (now != content.end()) {
			std::string target;

			while (now != content.end() && ISSPC(*now)) now++;
			auto nowPosition = now;
			if (now == content.end()) break;

			bool isDiv = ISDIV(*now);
			bool isLet = ISLET(*now);
			bool isNum = ISNUM(*now);
			char doubleDiv = *now;
			while (now != content.end() && ! ISSPC(*now)) {
				if (isLet && ISDIV(*now)) break;
				if (isDiv && (ISLET(*now) || ISNUM(*now))) break;
				if (isNum && ISDIV(*now)) break;
				if (ISDIV(*now)) {
					if (target.length() == 1) {
						if (*now == '='){
							if (doubleDiv != '<' && doubleDiv != '>' && doubleDiv != ':') break;
						} else break;
					} else if (target.length() >= 2) break;
				}
				target += *now;
				now++;
			}

			int symbol = getReservation(target);
			int number = 0;
			if (symbol == -1) {
				if (isNumber(target)) {
					symbol = constBase;
					number = getNumber(target);
				}
				if (isIdentifier(target)) symbol = identifierBase;
			}

			int targetPosition = nowPosition - content.begin();
			words.emplace_back(target, symbol, number, contentLine[targetPosition], contentRow[targetPosition]);

			if (symbol == -1) {
				std::cout << "parsing error in " << contentLine[targetPosition] <<
											 ":" << contentRow[targetPosition] << std::endl;
				return -1;
			}
		}
		return 0;
	}